

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O3

int appenddata(char **dst_buf,size_t *dst_len,size_t *dst_alloc,char *src_buf,int src_b64)

{
  size_t __n;
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  
  __n = strlen(src_buf);
  if (__n != 0) {
    sVar3 = *dst_len;
    uVar2 = sVar3 + __n + 1;
    if (src_b64 != 0) {
      lVar4 = __n - (src_buf[__n - 1] == '\r');
      __n = lVar4 - (ulong)(src_buf[lVar4 + -1] == '\n');
    }
    pcVar1 = *dst_buf;
    if (*dst_alloc < uVar2) {
      sVar3 = uVar2 * 2;
      pcVar1 = (char *)(*Curl_crealloc)(pcVar1,sVar3);
      if (pcVar1 == (char *)0x0) {
        return -1;
      }
      *dst_alloc = sVar3;
      *dst_buf = pcVar1;
      sVar3 = *dst_len;
    }
    memcpy(pcVar1 + sVar3,src_buf,__n);
    sVar3 = *dst_len;
    *dst_len = __n + sVar3;
    (*dst_buf)[__n + sVar3] = '\0';
  }
  return 0;
}

Assistant:

static int appenddata(char  **dst_buf,   /* dest buffer */
                      size_t *dst_len,   /* dest buffer data length */
                      size_t *dst_alloc, /* dest buffer allocated size */
                      char   *src_buf,   /* source buffer */
                      int     src_b64)   /* != 0 if source is base64 encoded */
{
  size_t need_alloc = 0;
  size_t src_len = strlen(src_buf);

  if(!src_len)
    return GPE_OK;

  need_alloc = src_len + *dst_len + 1;

  if(src_b64) {
    if(src_buf[src_len - 1] == '\r')
      src_len--;

    if(src_buf[src_len - 1] == '\n')
      src_len--;
  }

  /* enlarge destination buffer if required */
  if(need_alloc > *dst_alloc) {
    size_t newsize = need_alloc * 2;
    char *newptr = realloc(*dst_buf, newsize);
    if(!newptr) {
      return GPE_OUT_OF_MEMORY;
    }
    *dst_alloc = newsize;
    *dst_buf = newptr;
  }

  /* memcpy to support binary blobs */
  memcpy(*dst_buf + *dst_len, src_buf, src_len);
  *dst_len += src_len;
  *(*dst_buf + *dst_len) = '\0';

  return GPE_OK;
}